

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom js_parse_destructuring_var(JSParseState *s,int tok,int is_arg)

{
  JSAtom JVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  
  if ((((s->token).val != -0x7d) || ((s->token).u.ident.is_reserved != 0)) ||
     (((s->cur_func->js_mode & 1) != 0 &&
      ((JVar1 = (s->token).u.ident.atom, JVar1 == 0x4d || (JVar1 == 0x3a)))))) {
    js_parse_error(s,"invalid destructuring target");
    return 0;
  }
  JVar1 = (s->token).u.ident.atom;
  if (0xd1 < (long)(int)JVar1) {
    pJVar2 = s->ctx->rt->atom_array[(int)JVar1];
    (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
  }
  if (((tok == 0) || (iVar3 = js_parse_check_duplicate_parameter(s,JVar1), iVar3 == 0)) &&
     (iVar3 = next_token(s), iVar3 == 0)) {
    return JVar1;
  }
  JS_FreeAtom(s->ctx,JVar1);
  return 0;
}

Assistant:

static JSAtom js_parse_destructuring_var(JSParseState *s, int tok, int is_arg)
{
    JSAtom name;

    if (!(s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved)
    ||  ((s->cur_func->js_mode & JS_MODE_STRICT) &&
         (s->token.u.ident.atom == JS_ATOM_eval || s->token.u.ident.atom == JS_ATOM_arguments))) {
        js_parse_error(s, "invalid destructuring target");
        return JS_ATOM_NULL;
    }
    name = JS_DupAtom(s->ctx, s->token.u.ident.atom);
    if (is_arg && js_parse_check_duplicate_parameter(s, name))
        goto fail;
    if (next_token(s))
        goto fail;

    return name;
fail:
    JS_FreeAtom(s->ctx, name);
    return JS_ATOM_NULL;
}